

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O2

char ** glfwGetRequiredInstanceExtensions(uint32_t *count)

{
  GLFWbool GVar1;
  char *format;
  int error;
  
  *count = 0;
  if (_glfwInitialized == 0) {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan();
    if (GVar1 != 0) {
      *count = 2;
      return _glfw.vk.extensions;
    }
    format = "Vulkan: API not available";
    error = 0x10006;
  }
  _glfwInputError(error,format);
  return (char **)0x0;
}

Assistant:

GLFWAPI const char** glfwGetRequiredInstanceExtensions(uint32_t* count)
{
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan())
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "Vulkan: API not available");
        return NULL;
    }

    *count = 2;
    return (const char**) _glfw.vk.extensions;
}